

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_rust.cc
# Opt level: O0

bool absl::debugging_internal::DemangleRustSymbolEncoding(char *mangled,char *out,size_t out_size)

{
  bool bVar1;
  long in_RDX;
  char *in_RSI;
  char *in_RDI;
  RustSymbolParser *in_stack_fffffffffffffe68;
  
  anon_unknown_0::RustSymbolParser::RustSymbolParser
            ((RustSymbolParser *)&stack0xfffffffffffffe38,in_RDI,in_RSI,in_RSI + in_RDX);
  bVar1 = anon_unknown_0::RustSymbolParser::Parse(in_stack_fffffffffffffe68);
  return bVar1;
}

Assistant:

bool DemangleRustSymbolEncoding(const char* mangled, char* out,
                                size_t out_size) {
  return RustSymbolParser(mangled, out, out + out_size).Parse();
}